

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdi::ControlContainer::showButtonsInMenuBar(ControlContainer *this,QMenuBar *menuBar)

{
  bool bVar1;
  Int IVar2;
  ControllerWidget *pCVar3;
  QWidget *pQVar4;
  QWidget *in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  ControllerWidget *controllerWidget;
  QWidget *currentRight;
  QWidget *currentLeft;
  QWidget *in_stack_ffffffffffffff98;
  QWidget *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  Corner in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar5;
  QFlagsStorageHelper<Qt::WindowType,_4> local_14;
  QFlagsStorageHelper<Qt::WindowType,_4> local_10;
  QFlagsStorageHelper<Qt::WindowType,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = true;
  if (in_RSI != (QWidget *)0x0) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x62c596);
    uVar5 = true;
    if (bVar1) {
      QPointer<QMdiSubWindow>::operator->((QPointer<QMdiSubWindow> *)0x62c5b3);
      local_10.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)QWidget::windowFlags(in_stack_ffffffffffffffa0);
      local_c.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           QFlags<Qt::WindowType>::operator&
                     ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffffa0,
                      (WindowType)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
      uVar5 = IVar2 != 0;
    }
  }
  if ((bool)uVar5 == false) {
    QPointer<QMenuBar>::operator=
              ((QPointer<QMenuBar> *)in_stack_ffffffffffffffa0,(QMenuBar *)in_stack_ffffffffffffff98
              );
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x62c616);
    in_stack_ffffffffffffffac = in_stack_ffffffffffffffac & 0xffffff;
    if (bVar1) {
      QPointer<QMdiSubWindow>::operator->((QPointer<QMdiSubWindow> *)0x62c633);
      QWidget::windowFlags(in_stack_ffffffffffffffa0);
      local_14.super_QFlagsStorage<Qt::WindowType>.i =
           (QFlagsStorage<Qt::WindowType>)
           QFlags<Qt::WindowType>::operator&
                     ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffffa0,
                      (WindowType)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
      in_stack_ffffffffffffffac = CONCAT13(IVar2 != 0,(int3)in_stack_ffffffffffffffac);
    }
    if ((char)(in_stack_ffffffffffffffac >> 0x18) != '\0') {
      pQVar4 = QMenuBar::cornerWidget
                         ((QMenuBar *)CONCAT17(uVar5,in_stack_ffffffffffffffb8),
                          (Corner)((ulong)in_RDI >> 0x20));
      if (pQVar4 != (QWidget *)0x0) {
        QWidget::hide((QWidget *)0x62c696);
      }
      bVar1 = ::operator!=((QWidget **)in_stack_ffffffffffffffa0,
                           (QPointer<QWidget> *)in_stack_ffffffffffffff98);
      if (bVar1) {
        in_stack_ffffffffffffffa0 = in_RSI;
        ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62c6c7);
        QMenuBar::setCornerWidget
                  ((QMenuBar *)CONCAT17(uVar5,in_stack_ffffffffffffffb8),(QWidget *)in_RDI,
                   in_stack_ffffffffffffffac);
        QPointer<QWidget>::operator=
                  ((QPointer<QWidget> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62c6f7);
      QWidget::show((QWidget *)in_RDI);
    }
    ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62c70d);
    pCVar3 = qobject_cast<QMdi::ControllerWidget*>((QObject *)0x62c715);
    if ((pCVar3 != (ControllerWidget *)0x0) &&
       (bVar1 = ControllerWidget::hasVisibleControls
                          ((ControllerWidget *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)), bVar1)) {
      pQVar4 = QMenuBar::cornerWidget
                         ((QMenuBar *)CONCAT17(uVar5,in_stack_ffffffffffffffb8),
                          (Corner)((ulong)in_RDI >> 0x20));
      if (pQVar4 != (QWidget *)0x0) {
        QWidget::hide((QWidget *)0x62c75f);
      }
      bVar1 = ::operator!=((QWidget **)in_stack_ffffffffffffffa0,
                           (QPointer<QWidget> *)in_stack_ffffffffffffff98);
      if (bVar1) {
        ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62c78f);
        QMenuBar::setCornerWidget
                  ((QMenuBar *)CONCAT17(uVar5,in_stack_ffffffffffffffb8),(QWidget *)in_RDI,
                   in_stack_ffffffffffffffac);
        QPointer<QWidget>::operator=((QPointer<QWidget> *)in_stack_ffffffffffffffa0,in_RSI);
      }
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62c7c1);
      QWidget::show((QWidget *)in_RDI);
    }
    QPointer<QMdiSubWindow>::operator->((QPointer<QMdiSubWindow> *)0x62c7d7);
    QMdiSubWindow::d_func((QMdiSubWindow *)0x62c7df);
    QMdiSubWindowPrivate::setNewWindowTitle(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ControlContainer::showButtonsInMenuBar(QMenuBar *menuBar)
{
    if (!menuBar || !mdiChild || mdiChild->windowFlags() & Qt::FramelessWindowHint)
        return;
    m_menuBar = menuBar;

    if (m_menuLabel && mdiChild->windowFlags() & Qt::WindowSystemMenuHint) {
        QWidget *currentLeft = menuBar->cornerWidget(Qt::TopLeftCorner);
        if (currentLeft)
            currentLeft->hide();
        if (currentLeft != m_menuLabel) {
            menuBar->setCornerWidget(m_menuLabel, Qt::TopLeftCorner);
            previousLeft = currentLeft;
        }
        m_menuLabel->show();
    }
    ControllerWidget *controllerWidget = qobject_cast<ControllerWidget *>(m_controllerWidget);
    if (controllerWidget && controllerWidget->hasVisibleControls()) {
        QWidget *currentRight = menuBar->cornerWidget(Qt::TopRightCorner);
        if (currentRight)
            currentRight->hide();
        if (currentRight != m_controllerWidget) {
            menuBar->setCornerWidget(m_controllerWidget, Qt::TopRightCorner);
            previousRight = currentRight;
        }
        m_controllerWidget->show();
    }
    mdiChild->d_func()->setNewWindowTitle();
}